

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# screen.cpp
# Opt level: O2

int init_screen(void)

{
  int iVar1;
  int iVar2;
  
  initscr();
  iVar1 = cbreak();
  iVar2 = -1;
  if (iVar1 == 0) {
    iVar1 = noecho();
    if (iVar1 == 0) {
      iVar1 = keypad(_stdscr,1);
      if (iVar1 == 0) {
        nodelay(_stdscr,1);
        iVar2 = curs_set(0);
        iVar2 = -(uint)(iVar2 == -1);
      }
    }
  }
  return iVar2;
}

Assistant:

int init_screen()
{
    // initialize ncurses
    initscr();
    // disable console buffering
    if (cbreak() != OK)
        return -1;
    // do not show typed characters
    if (noecho() != OK)
        return -1;
    // enable sensing all keys as single values
    if (keypad(stdscr, true) != OK)
        return -1;

    // make getch non-blocking
    nodelay(stdscr, true);

    // make cursor invisible
    if (curs_set(0) == ERR)
        return -1;

    return 0;
}